

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

int do_with_oh<int>(qpdf_data qpdf,qpdf_oh oh,function<int_()> *fallback,
                   function<int_(QPDFObjectHandle_&)> *fn)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  undefined1 auVar3 [4];
  _Node *p_Var4;
  char *cstr;
  Pipeline *this_00;
  int ret;
  undefined1 local_e4 [4];
  undefined1 local_e0 [8];
  undefined1 local_d8 [24];
  _Invoker_type p_Stack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  int local_a4;
  _Any_data local_a0;
  code *local_90;
  undefined8 uStack_88;
  qpdf_oh local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::function<int_()>::function((function<int_()> *)&local_38,fallback);
  std::function<int_(QPDFObjectHandle_&)>::function
            ((function<int_(QPDFObjectHandle_&)> *)&local_a0,fn);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_80 = oh;
  local_78._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_78._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 0x18) = uStack_88;
  if (local_90 != (code *)0x0) {
    *(void **)local_78._M_unused._0_8_ = local_a0._M_unused._M_object;
    *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_a0._8_8_;
    *(code **)((long)local_78._M_unused._0_8_ + 0x10) = local_90;
    local_90 = (code *)0x0;
    uStack_88 = 0;
  }
  *(qpdf_oh *)((long)local_78._M_unused._0_8_ + 0x20) = oh;
  pcStack_60 = std::
               _Function_handler<int_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<int_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_e0 = (undefined1  [8])local_e4;
  std::function<int_(_qpdf_data_*)>::function
            ((function<int_(_qpdf_data_*)> *)local_d8,(function<int_(_qpdf_data_*)> *)&local_78);
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_58._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_58._M_unused._0_8_ = local_e0;
  *(long *)((long)local_58._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_58._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_58._M_unused._0_8_ + 0x20) = p_Stack_c0;
  if ((code *)local_d8._16_8_ != (code *)0x0) {
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_d8._0_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x10) = local_d8._8_8_;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 0x18) = local_d8._16_8_;
    local_d8._16_8_ = (code *)0x0;
    p_Stack_c0 = (_Invoker_type)0x0;
  }
  pcStack_40 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf,(function<void_(_qpdf_data_*)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((code *)local_d8._16_8_ != (code *)0x0) {
    (*(code *)local_d8._16_8_)
              ((function<int_(_qpdf_data_*)> *)local_d8,(function<int_(_qpdf_data_*)> *)local_d8,3);
  }
  auVar3 = local_e4;
  if (1 < uVar2) {
    if (qpdf->silence_errors == false) {
      if (qpdf->oh_error_occurred == false) {
        local_b8._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_e0,
                   (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_a4 = 0;
        p_Var4 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf->warnings,
                            (qpdf_error_code_e *)&local_b8._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e0,(char (*) [1])0x27ed0e,&local_a4,
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(qpdf->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_e0 != (undefined1  [8])(local_d8 + 8)) {
          operator_delete((void *)local_e0,local_d8._8_8_ + 1);
        }
        qpdf->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_e0,SUB41(local_b8._M_allocated_capacity._0_4_,0));
      this = local_e0;
      cstr = (char *)(**(code **)(*(long *)(qpdf->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
      }
    }
    if (local_28 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    auVar3 = (undefined1  [4])(*local_20)(&local_38);
  }
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return (int)auVar3;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}